

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  undefined1 local_108 [8];
  string shader_source;
  uint local_e0;
  int sub_script_index;
  int permutation;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [36];
  undefined4 local_5c;
  undefined1 local_58 [4];
  int test_array_dimensions;
  string base_variable_string;
  string prefix;
  TestShaderType tested_shader_type_local;
  ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  std::__cxx11::string::string((string *)(base_variable_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_5c = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"    float a",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&permutation,"[1]",(allocator<char> *)((long)&sub_script_index + 3));
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_80,this,local_a0,&permutation,4);
  std::__cxx11::string::operator=
            ((string *)(base_variable_string.field_2._M_local_buf + 8),local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&permutation);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub_script_index + 3));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::operator+=
            ((string *)(base_variable_string.field_2._M_local_buf + 8),
             " = float[][][][](\n       float[][][](\n           float[][](\n               float[](1.0))));\n"
            );
  std::__cxx11::string::operator+=
            ((string *)(base_variable_string.field_2._M_local_buf + 8),"    float b");
  for (local_e0 = 0; (int)local_e0 < 0x10; local_e0 = local_e0 + 1) {
    std::__cxx11::string::operator=
              ((string *)local_58,(string *)(base_variable_string.field_2._M_local_buf + 8));
    for (shader_source.field_2._12_4_ = 3; -1 < (int)shader_source.field_2._12_4_;
        shader_source.field_2._12_4_ = shader_source.field_2._12_4_ + -1) {
      if ((local_e0 & 1 << ((byte)shader_source.field_2._12_4_ & 0x1f)) == 0) {
        std::__cxx11::string::operator+=((string *)local_58,"[2]");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_58,"[1]");
      }
    }
    std::__cxx11::string::operator+=((string *)local_58,";\n\n");
    if (local_e0 != 0xf) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     shader_start_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::__cxx11::string::operator+=((string *)local_108,"    b = a;\n");
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)local_108,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)local_108,(string *)emit_quad_abi_cxx11_);
        break;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)local_108,(string *)set_tesseation_abi_cxx11_);
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xb29);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)local_108,(string *)shader_end_abi_cxx11_);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(this,(ulong)tested_shader_type,local_108);
      std::__cxx11::string::~string((string *)local_108);
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(base_variable_string.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ExpressionsAssignment3<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string prefix, base_variable_string;

	const int test_array_dimensions = 4;

	prefix = this->extend_string("    float a", "[1]", 4);
	prefix += " = float[][][][](\n"
			  "       float[][][](\n"
			  "           float[][](\n"
			  "               float[](1.0))));\n";

	prefix += "    float b";

	for (int permutation = 0; permutation < (1 << test_array_dimensions); permutation++)
	{
		base_variable_string = prefix;

		for (int sub_script_index = test_array_dimensions - 1; sub_script_index >= 0; sub_script_index--)
		{
			if (permutation & (1 << sub_script_index))
			{
				base_variable_string += "[1]";
			}
			else
			{
				base_variable_string += "[2]";
			}
		}

		base_variable_string += ";\n\n";

		if (permutation != (1 << test_array_dimensions) - 1)
		{
			std::string shader_source = shader_start + base_variable_string;

			shader_source += "    b = a;\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if (permutation != (1 << test_array_dimensions) - 1) */
	}	 /* for (int permutation = 0; ...) */
}